

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void helper_booke206_tlbsx_ppc64(CPUPPCState_conflict2 *env,target_ulong address)

{
  ppcmas_tlb_t *tlb;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  char cVar5;
  long lVar6;
  uint uVar7;
  target_ulong *ptVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uintptr_t tlbml;
  hwaddr raddr;
  uint local_68;
  uint local_58;
  hwaddr local_38;
  
  uVar2 = env->spr[0x276];
  lVar12 = 0;
  do {
    uVar11 = (uint)env->spr[lVar12 + 0x2b0];
    local_68 = (uint)uVar2;
    if (0xffffff < uVar11) {
      uVar9 = uVar11 & 0xfff;
      if (uVar9 == 0) {
        cVar5 = '\0';
      }
      else {
        iVar10 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
          }
        }
        cVar5 = (char)iVar10;
      }
      uVar11 = uVar11 >> 0x18;
      iVar10 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
        }
      }
      local_58 = (uint)(address >> 0xc);
      uVar7 = 0;
      do {
        uVar3 = uVar7 & uVar11 + 0x7fffffff |
                (~(-1 << (cVar5 - (byte)iVar10 & 0x1f)) & local_58) << ((byte)iVar10 & 0x3f);
        if ((int)uVar3 < (int)uVar9) {
          if (lVar12 != 0) {
            lVar6 = 0;
            do {
              uVar3 = uVar3 + ((uint)env->spr[lVar6 + 0x2b0] & 0xfff);
              lVar6 = lVar6 + 1;
            } while (lVar12 != lVar6);
          }
          if ((env->tlb).tlb6 != (ppc6xx_tlb_t_conflict2 *)0x0) {
            tlb = (ppcmas_tlb_t *)((env->tlb).tlb6 + (int)uVar3);
            iVar4 = ppcmas_tlb_check((CPUPPCState_conflict2 *)env->msr,tlb,&local_38,address,
                                     (uint)(uVar2 >> 0x10) & 0x3fff);
            if ((iVar4 == 0) && (uVar1 = tlb->mas1, ((uVar1 >> 0xc ^ local_68) & 1) == 0)) {
              ptVar8 = env->spr + 0x2b0;
              lVar12 = 0;
              iVar10 = 0;
              goto LAB_00b5aaae;
            }
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar11);
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 4) {
      uVar9 = (uint)env->spr[0x274];
      env->spr[0x272] = (ulong)(uVar9 & 0x1f);
      env->spr[0x273] = 0;
      env->spr[0x3b0] = 0;
      env->spr[0x271] = uVar2 & 0xffffffffffff0000 | (ulong)((local_68 & 1) << 0xc | uVar9 & 0xf80);
      iVar10 = env->last_way;
      uVar11 = *(byte *)((long)env->spr + 0x1583) - 1 & iVar10 + 1U;
      env->last_way = uVar11;
      env->spr[0x270] = (long)(int)uVar11 | (long)(iVar10 << 0x10) | (ulong)(uVar9 & 0x30000000);
      return;
    }
  } while( true );
LAB_00b5aaae:
  iVar10 = ((uint)*ptVar8 & 0xfff) + iVar10;
  uVar11 = (uint)((ulong)((long)(int)uVar3 * 0x18) / 0x18);
  if ((int)uVar11 < iVar10) {
    lVar6 = 0;
    iVar10 = 0;
    do {
      iVar10 = ((uint)env->spr[lVar6 + 0x2b0] & 0xfff) + iVar10;
      if ((int)uVar11 < iVar10) {
        env->spr[0x270] =
             (long)(int)((uint)lVar12 | env->last_way |
                        (*(byte *)((long)env->spr + lVar6 * 8 + 0x1583) - 1 & uVar11) << 0x10);
        env->spr[0x271] = (ulong)uVar1;
        env->spr[0x272] = tlb->mas2;
        uVar2 = tlb->mas7_3;
        env->spr[0x273] = uVar2;
        env->spr[0x3b0] = uVar2 >> 0x20;
        return;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
LAB_00b5aafc:
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"Unknown TLBe: %d\n");
  }
  lVar12 = lVar12 + 0x10000000;
  ptVar8 = ptVar8 + 1;
  if (lVar12 == 0x40000000) goto LAB_00b5aafc;
  goto LAB_00b5aaae;
}

Assistant:

void helper_booke206_tlbsx(CPUPPCState *env, target_ulong address)
{
    ppcmas_tlb_t *tlb = NULL;
    int i, j;
    hwaddr raddr;
    uint32_t spid, sas;

    spid = (env->spr[SPR_BOOKE_MAS6] & MAS6_SPID_MASK) >> MAS6_SPID_SHIFT;
    sas = env->spr[SPR_BOOKE_MAS6] & MAS6_SAS;

    for (i = 0; i < BOOKE206_MAX_TLBN; i++) {
        int ways = booke206_tlb_ways(env, i);

        for (j = 0; j < ways; j++) {
            tlb = booke206_get_tlbm(env, i, address, j);

            if (!tlb) {
                continue;
            }

            if (ppcmas_tlb_check(env, tlb, &raddr, address, spid)) {
                continue;
            }

            if (sas != ((tlb->mas1 & MAS1_TS) >> MAS1_TS_SHIFT)) {
                continue;
            }

            booke206_tlb_to_mas(env, tlb);
            return;
        }
    }

    /* no entry found, fill with defaults */
    env->spr[SPR_BOOKE_MAS0] = env->spr[SPR_BOOKE_MAS4] & MAS4_TLBSELD_MASK;
    env->spr[SPR_BOOKE_MAS1] = env->spr[SPR_BOOKE_MAS4] & MAS4_TSIZED_MASK;
    env->spr[SPR_BOOKE_MAS2] = env->spr[SPR_BOOKE_MAS4] & MAS4_WIMGED_MASK;
    env->spr[SPR_BOOKE_MAS3] = 0;
    env->spr[SPR_BOOKE_MAS7] = 0;

    if (env->spr[SPR_BOOKE_MAS6] & MAS6_SAS) {
        env->spr[SPR_BOOKE_MAS1] |= MAS1_TS;
    }

    env->spr[SPR_BOOKE_MAS1] |= (env->spr[SPR_BOOKE_MAS6] >> 16)
        << MAS1_TID_SHIFT;

    /* next victim logic */
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_ESEL_SHIFT;
    env->last_way++;
    env->last_way &= booke206_tlb_ways(env, 0) - 1;
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_NV_SHIFT;
}